

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptPromiseReactionTaskFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseReactionTaskFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptPromiseReaction *reaction,
          Var argument)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  DynamicType *type;
  JavascriptPromiseReactionTaskFunction *this_01;
  undefined1 local_70 [8];
  TrackAllocData data;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_31;
  
  local_70 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x19eb;
  data._32_8_ = argument;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x37a1d4);
  FunctionInfo::FunctionInfo(this_00,entryPoint,ErrorOnNew,0xffffffff,(FunctionProxy *)0x0);
  type = CreateDeferredPrototypeFunctionType(this,entryPoint);
  local_70 = (undefined1  [8])&JavascriptPromiseReactionTaskFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x19ee;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  this_01 = (JavascriptPromiseReactionTaskFunction *)
            new<(Memory::ObjectInfoBits)1>(0x50,pRVar1,&local_31);
  JavascriptPromiseReactionTaskFunction::JavascriptPromiseReactionTaskFunction
            (this_01,type,this_00,reaction,(Var)data._32_8_);
  return this_01;
}

Assistant:

JavascriptPromiseReactionTaskFunction* JavascriptLibrary::CreatePromiseReactionTaskFunction(JavascriptMethod entryPoint, JavascriptPromiseReaction* reaction, Var argument)
    {
        FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint, FunctionInfo::Attributes::ErrorOnNew);
        DynamicType* type = CreateDeferredPrototypeFunctionType(entryPoint);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseReactionTaskFunction, type, functionInfo, reaction, argument);
    }